

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstr.hpp
# Opt level: O3

void __thiscall zstr::Exception::Exception(Exception *this,z_stream *zstrm_p,int ret)

{
  int in_ECX;
  undefined4 in_register_00000014;
  string local_30;
  
  error_to_message_abi_cxx11_
            (&local_30,(Exception *)zstrm_p,(z_stream *)CONCAT44(in_register_00000014,ret),in_ECX);
  std::ios_base::failure[abi:cxx11]::failure((string *)this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  *(undefined ***)this = &PTR__failure_00440638;
  return;
}

Assistant:

Exception(z_stream* zstrm_p, int ret)
      : std::ios_base::failure(error_to_message(zstrm_p, ret)) {}